

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
::rebalance_or_split
          (btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
           *this,iterator *iter)

{
  btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  bVar1;
  btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  bVar2;
  byte bVar3;
  byte bVar4;
  field_type fVar5;
  btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  *pbVar6;
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  *pbVar7;
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  *pbVar8;
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  bVar9;
  char *__function;
  btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  *pbVar14;
  int iVar15;
  CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>
  *alloc;
  iterator parent_iter;
  iterator local_40;
  
  bVar1 = (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
           )btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
            ::count((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                     *)iter->node_);
  pbVar6 = iter->node_;
  if (((ulong)pbVar6 & 7) == 0) {
    bVar2 = (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
             )0x1e;
    if (pbVar6[0xb] !=
        (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
         )0x0) {
      bVar2 = pbVar6[0xb];
    }
    if (bVar1 != bVar2) {
      __assert_fail("node->count() == node->max_count()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                    ,0xa33,
                    "void absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>]"
                   );
    }
    if (bVar1 != (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                  )0x1e) {
      __assert_fail("kNodeSlots == node->max_count()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                    ,0xa34,
                    "void absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>]"
                   );
    }
    pbVar14 = *(btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                **)pbVar6;
    if (pbVar6 == (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                   *)this->root_) {
      pbVar7 = (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                *)Allocate<8ul,std::allocator<google::protobuf::FileDescriptor_const*>>
                            ((allocator<const_google::protobuf::FileDescriptor_*> *)
                             &this->rightmost_,0x1f8);
      btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
      ::init_internal(pbVar7,'\0',pbVar14);
      fVar5 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
              ::start(pbVar7);
      btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
      ::init_child(pbVar7,fVar5,
                   (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                    *)iter->node_);
      this->root_ = pbVar7;
      fVar5 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
              ::start(pbVar7);
      pbVar8 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
               ::child(pbVar7,fVar5);
      if (((ulong)pbVar8 & 7) == 0) {
        pbVar14 = pbVar7;
        if (pbVar8[0xb] !=
            (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
             )0x0) {
          fVar5 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                  ::start(pbVar7);
          pbVar7 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                   ::child(pbVar7,fVar5);
          if (pbVar7 != (this->rightmost_).
                        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                        .
                        super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
                        .value) {
            __assert_fail("parent->start_child()->is_internal() || parent->start_child() == rightmost()"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                          ,0xa87,
                          "void absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>]"
                         );
          }
        }
        goto LAB_001d89ee;
      }
    }
    else {
      bVar1 = pbVar6[8];
      bVar2 = (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
               )btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                ::start(pbVar14);
      if ((byte)bVar2 < (byte)bVar1) {
        if ((((ulong)iter->node_ & 7) != 0) ||
           (pbVar6 = (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                      *)btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                        ::child(pbVar14,(char)iter->node_[8] + 0xff), ((ulong)pbVar6 & 7) != 0))
        goto LAB_001d8b28;
        if ((((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
               *)pbVar6)[0xb] !=
             (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
              )0x0) &&
           (((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
              *)pbVar6)[0xb] !=
            (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
             )0x1e)) {
          __assert_fail("left->max_count() == kNodeSlots",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                        ,0xa3c,
                        "void absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>]"
                       );
        }
        bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                ::count((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                         *)pbVar6);
        if (bVar3 < 0x1e) {
          bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                  ::count((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                           *)pbVar6);
          uVar13 = iter->position_;
          uVar11 = 0x1e - bVar3 >> ((uVar13 & 0xfe) < 0x1e);
          uVar11 = uVar11 + ((char)uVar11 == '\0');
          uVar12 = uVar11 & 0xff;
          bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                  ::start((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                           *)iter->node_);
          if (((int)(uint)bVar3 <= (int)((uVar13 & 0xff) - uVar12)) ||
             (bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                      ::count((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                               *)pbVar6), bVar3 + uVar12 < 0x1e)) {
            btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
            ::rebalance_right_to_left
                      ((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                        *)pbVar6,(field_type)uVar11,
                       (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                        *)iter->node_,(allocator_type *)&this->rightmost_);
            pbVar14 = (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                       *)iter->node_;
            if (((ulong)pbVar14 & 7) == 0) {
              bVar9 = (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                       )0x1e;
              if (pbVar14[0xb] !=
                  (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                   )0x0) {
                bVar9 = pbVar14[0xb];
              }
              bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                      ::count(pbVar14);
              if ((uint)(byte)bVar9 - (uint)bVar3 != uVar12) {
                __assert_fail("node->max_count() - node->count() == to_move",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                              ,0xa4b,
                              "void absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>]"
                             );
              }
              iVar15 = (byte)iter->position_ - uVar12;
              iter->position_ = iVar15;
              bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                      ::start((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                               *)iter->node_);
              if (iVar15 < (int)(uint)bVar3) {
                iVar15 = iter->position_;
                bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                        ::count((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                                 *)pbVar6);
                iter->position_ = (uint)bVar3 + iVar15 + 1;
                iter->node_ = pbVar6;
              }
              else {
                pbVar6 = iter->node_;
              }
              bVar1 = (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                       )btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                        ::count((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                                 *)pbVar6);
              if (((ulong)iter->node_ & 7) == 0) {
                bVar2 = iter->node_[0xb];
                bVar10 = (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                          )0x1e;
                if (bVar2 != (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                              )0x0) {
                  bVar10 = bVar2;
                }
                if ((byte)bVar1 < (byte)bVar10) {
                  return;
                }
                __assert_fail("node->count() < node->max_count()",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                              ,0xa53,
                              "void absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>]"
                             );
              }
            }
            goto LAB_001d8b28;
          }
        }
      }
      if ((((ulong)iter->node_ & 7) == 0) && (((ulong)pbVar14 & 7) == 0)) {
        bVar9 = *(btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                  *)(iter->node_ + 8);
        if ((byte)bVar9 < (byte)pbVar14[10]) {
          pbVar7 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                   ::child(pbVar14,(char)bVar9 + 1);
          if (((ulong)pbVar7 & 7) == 0) {
            if ((pbVar7[0xb] !=
                 (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                  )0x0) &&
               (pbVar7[0xb] !=
                (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                 )0x1e)) {
              __assert_fail("right->max_count() == kNodeSlots",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                            ,0xa5c,
                            "void absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>]"
                           );
            }
            bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                    ::count(pbVar7);
            if (0x1d < bVar3) goto LAB_001d8901;
            bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                    ::count(pbVar7);
            iVar15 = iter->position_;
            bVar4 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                    ::start((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                             *)iter->node_);
            uVar13 = 0x1e - bVar3 >> ((int)(uint)bVar4 < iVar15);
            uVar13 = uVar13 + ((char)uVar13 == '\0');
            pbVar6 = iter->node_;
            if (((ulong)pbVar6 & 7) == 0) {
              uVar11 = uVar13 & 0xff;
              if ((int)((byte)pbVar6[10] - uVar11) < (int)(uint)(byte)iter->position_) {
                bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                        ::count(pbVar7);
                if (0x1d < bVar3 + uVar11) goto LAB_001d8901;
                pbVar6 = iter->node_;
              }
              btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
              ::rebalance_left_to_right
                        ((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                          *)pbVar6,(field_type)uVar13,pbVar7,(allocator_type *)&this->rightmost_);
              pbVar14 = (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                         *)iter->node_;
              if (((ulong)pbVar14 & 7) == 0) {
                iVar15 = iter->position_;
                if ((int)(uint)(byte)pbVar14[10] < iVar15) {
                  bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                          ::count(pbVar14);
                  iter->position_ = iVar15 + ~(uint)bVar3;
                  iter->node_ = (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                                 *)pbVar7;
                  pbVar14 = pbVar7;
                }
                bVar1 = (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                         )btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                          ::count(pbVar14);
                if (((ulong)iter->node_ & 7) == 0) {
                  bVar2 = iter->node_[0xb];
                  bVar10 = (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                            )0x1e;
                  if (bVar2 != (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                                )0x0) {
                    bVar10 = bVar2;
                  }
                  if ((byte)bVar1 < (byte)bVar10) {
                    return;
                  }
                  __assert_fail("node->count() < node->max_count()",
                                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                                ,0xa6f,
                                "void absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>]"
                               );
                }
              }
            }
          }
        }
        else {
LAB_001d8901:
          if ((pbVar14[0xb] !=
               (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                )0x0) &&
             (pbVar14[0xb] !=
              (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
               )0x1e)) {
            __assert_fail("parent->max_count() == kNodeSlots",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                          ,0xa77,
                          "void absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>::rebalance_or_split(iterator *) [Params = absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>]"
                         );
          }
          fVar5 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                  ::count(pbVar14);
          if (fVar5 == '\x1e') {
            if (((ulong)iter->node_ & 7) != 0) goto LAB_001d8b28;
            local_40.position_ = (int)(byte)iter->node_[8];
            local_40.node_ =
                 (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                  *)pbVar14;
            rebalance_or_split(this,&local_40);
            if (((ulong)iter->node_ & 7) != 0) {
              __function = 
              "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 0UL, Char = const char]"
              ;
              goto LAB_001d8b3d;
            }
            pbVar14 = *(btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                        **)iter->node_;
          }
LAB_001d89ee:
          pbVar6 = iter->node_;
          if (((ulong)pbVar6 & 7) == 0) {
            bVar1 = pbVar6[8];
            alloc = &this->rightmost_;
            if (pbVar6[0xb] ==
                (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                 )0x0) {
              pbVar7 = (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                        *)Allocate<8ul,std::allocator<google::protobuf::FileDescriptor_const*>>
                                    ((allocator<const_google::protobuf::FileDescriptor_*> *)alloc,
                                     0x1f8);
              btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
              ::init_internal(pbVar7,(char)bVar1 + '\x01',pbVar14);
              btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
              ::split((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                       *)iter->node_,iter->position_,pbVar7,(allocator_type *)alloc);
            }
            else {
              pbVar7 = (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                        *)Allocate<8ul,std::allocator<google::protobuf::FileDescriptor_const*>>
                                    ((allocator<const_google::protobuf::FileDescriptor_*> *)alloc,
                                     0x100);
              btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
              ::init_leaf(pbVar7,(char)bVar1 + '\x01','\x1e',pbVar14);
              btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
              ::split((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                       *)iter->node_,iter->position_,pbVar7,(allocator_type *)alloc);
              if ((btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                   *)(alloc->
                     super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                     ).
                     super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
                     .value == iter->node_) {
                (alloc->
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                ).
                super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
                .value = pbVar7;
              }
            }
            pbVar14 = (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                       *)iter->node_;
            if (((ulong)pbVar14 & 7) == 0) {
              iVar15 = iter->position_;
              if ((int)(uint)(byte)pbVar14[10] < iVar15) {
                bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                        ::count(pbVar14);
                iter->position_ = iVar15 + ~(uint)bVar3;
                iter->node_ = (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                               *)pbVar7;
              }
              return;
            }
          }
        }
      }
    }
  }
LAB_001d8b28:
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
  ;
LAB_001d8b3d:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,__function);
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
  node_type *&node = iter->node_;
  int &insert_position = iter->position_;
  assert(node->count() == node->max_count());
  assert(kNodeSlots == node->max_count());

  // First try to make room on the node by rebalancing.
  node_type *parent = node->parent();
  if (node != root()) {
    if (node->position() > parent->start()) {
      // Try rebalancing with our left sibling.
      node_type *left = parent->child(node->position() - 1);
      assert(left->max_count() == kNodeSlots);
      if (left->count() < kNodeSlots) {
        // We bias rebalancing based on the position being inserted. If we're
        // inserting at the end of the right node then we bias rebalancing to
        // fill up the left node.
        field_type to_move =
            (kNodeSlots - left->count()) /
            (1 + (static_cast<field_type>(insert_position) < kNodeSlots));
        to_move = (std::max)(field_type{1}, to_move);

        if (static_cast<field_type>(insert_position) - to_move >=
                node->start() ||
            left->count() + to_move < kNodeSlots) {
          left->rebalance_right_to_left(to_move, node, mutable_allocator());

          assert(node->max_count() - node->count() == to_move);
          insert_position = static_cast<int>(
              static_cast<field_type>(insert_position) - to_move);
          if (insert_position < node->start()) {
            insert_position = insert_position + left->count() + 1;
            node = left;
          }

          assert(node->count() < node->max_count());
          return;
        }
      }
    }

    if (node->position() < parent->finish()) {
      // Try rebalancing with our right sibling.
      node_type *right = parent->child(node->position() + 1);
      assert(right->max_count() == kNodeSlots);
      if (right->count() < kNodeSlots) {
        // We bias rebalancing based on the position being inserted. If we're
        // inserting at the beginning of the left node then we bias rebalancing
        // to fill up the right node.
        field_type to_move = (kNodeSlots - right->count()) /
                             (1 + (insert_position > node->start()));
        to_move = (std::max)(field_type{1}, to_move);

        if (static_cast<field_type>(insert_position) <=
                node->finish() - to_move ||
            right->count() + to_move < kNodeSlots) {
          node->rebalance_left_to_right(to_move, right, mutable_allocator());

          if (insert_position > node->finish()) {
            insert_position = insert_position - node->count() - 1;
            node = right;
          }

          assert(node->count() < node->max_count());
          return;
        }
      }
    }

    // Rebalancing failed, make sure there is room on the parent node for a new
    // value.
    assert(parent->max_count() == kNodeSlots);
    if (parent->count() == kNodeSlots) {
      iterator parent_iter(parent, node->position());
      rebalance_or_split(&parent_iter);
      parent = node->parent();
    }
  } else {
    // Rebalancing not possible because this is the root node.
    // Create a new root node and set the current root node as the child of the
    // new root.
    parent = new_internal_node(/*position=*/0, parent);
    parent->set_generation(root()->generation());
    parent->init_child(parent->start(), node);
    mutable_root() = parent;
    // If the former root was a leaf node, then it's now the rightmost node.
    assert(parent->start_child()->is_internal() ||
           parent->start_child() == rightmost());
  }

  // Split the node.
  node_type *split_node;
  if (node->is_leaf()) {
    split_node = new_leaf_node(node->position() + 1, parent);
    node->split(insert_position, split_node, mutable_allocator());
    if (rightmost() == node) mutable_rightmost() = split_node;
  } else {
    split_node = new_internal_node(node->position() + 1, parent);
    node->split(insert_position, split_node, mutable_allocator());
  }

  if (insert_position > node->finish()) {
    insert_position = insert_position - node->count() - 1;
    node = split_node;
  }
}